

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O1

void __thiscall OpenMD::CutoffGroup::updateCOM(CutoffGroup *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  pointer ppAVar5;
  pointer pVVar6;
  undefined8 uVar7;
  double dVar8;
  uint uVar9;
  uint i_5;
  long lVar10;
  pointer ppAVar11;
  uint i_4;
  pointer pVVar12;
  DataStorage *this_00;
  long lVar13;
  Atom *pAVar14;
  uint i;
  RealType RVar15;
  Vector<double,_3U> result;
  double local_58 [4];
  double local_38 [4];
  
  this_00 = (DataStorage *)
            ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->storage_);
  uVar9 = DataStorage::getStorageLayout(this_00);
  ppAVar11 = (this->cutoffAtomList).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)(this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppAVar11 == 8) {
    pAVar14 = *ppAVar11;
    lVar13 = *(long *)((long)&(((pAVar14->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                              atomData).position + (pAVar14->super_StuntDouble).storage_);
    lVar10 = (long)(pAVar14->super_StuntDouble).localIndex_;
    iVar4 = this->localIndex_;
    puVar1 = (undefined8 *)(lVar13 + lVar10 * 0x18);
    uVar7 = *puVar1;
    dVar3 = (double)puVar1[1];
    pVVar12 = (this_00->position).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + 0x10) =
         *(double *)(lVar13 + 0x10 + lVar10 * 0x18);
    pVVar12 = pVVar12 + iVar4;
    (pVVar12->super_Vector<double,_3U>).data_[0] = (double)uVar7;
    *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + 8) = dVar3;
    if ((uVar9 & 2) != 0) {
      pAVar14 = *ppAVar11;
      lVar13 = *(long *)((long)&(((pAVar14->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).velocity + (pAVar14->super_StuntDouble).storage_);
      lVar10 = (long)(pAVar14->super_StuntDouble).localIndex_;
      pVVar12 = (this_00->velocity).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (double *)(lVar13 + lVar10 * 0x18);
      dVar3 = *pdVar2;
      dVar8 = pdVar2[1];
      pVVar12[iVar4].super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar10 * 0x18);
      pVVar12 = pVVar12 + iVar4;
      (pVVar12->super_Vector<double,_3U>).data_[0] = dVar3;
      (pVVar12->super_Vector<double,_3U>).data_[1] = dVar8;
    }
  }
  else {
    RVar15 = getMass(this);
    iVar4 = this->localIndex_;
    pVVar12 = (this_00->position).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar4;
    if (pVVar12 != (pointer)&OpenMD::V3Zero) {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar13) =
             *(undefined8 *)((long)&OpenMD::V3Zero + lVar13);
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x18);
    }
    if (((uVar9 & 2) != 0) &&
       (pVVar12 = (this_00->velocity).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar4,
       pVVar12 != (pointer)&OpenMD::V3Zero)) {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar13) =
             *(undefined8 *)((long)&OpenMD::V3Zero + lVar13);
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x18);
    }
    ppAVar11 = (this->cutoffAtomList).
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppAVar5 = (this->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar11 == ppAVar5) {
      pAVar14 = (Atom *)0x0;
    }
    else {
      pAVar14 = *ppAVar11;
    }
    if (pAVar14 != (Atom *)0x0) {
      pVVar12 = (this_00->position).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar3 = (pAVar14->super_StuntDouble).mass_;
        lVar10 = (long)(pAVar14->super_StuntDouble).localIndex_;
        lVar13 = *(long *)((long)&(((pAVar14->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                  atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (pAVar14->super_StuntDouble).storage_);
        local_38[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar10 * 0x18);
        pdVar2 = (double *)(lVar13 + lVar10 * 0x18);
        local_38[0] = *pdVar2;
        local_38[1] = pdVar2[1];
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        lVar13 = 0;
        do {
          local_58[lVar13] = local_38[lVar13] * dVar3;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        do {
          *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + lVar13 * 8) =
               local_58[lVar13] +
               *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + lVar13 * 8);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        if ((uVar9 & 2) != 0) {
          dVar3 = (pAVar14->super_StuntDouble).mass_;
          lVar10 = (long)(pAVar14->super_StuntDouble).localIndex_;
          lVar13 = *(long *)((long)&(((pAVar14->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar14->super_StuntDouble).storage_);
          local_38[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar10 * 0x18);
          pdVar2 = (double *)(lVar13 + lVar10 * 0x18);
          local_38[0] = *pdVar2;
          local_38[1] = pdVar2[1];
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          lVar13 = 0;
          do {
            local_58[lVar13] = local_38[lVar13] * dVar3;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pVVar6 = (this_00->velocity).
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = 0;
          do {
            pVVar6[iVar4].super_Vector<double,_3U>.data_[lVar13] =
                 local_58[lVar13] + pVVar6[iVar4].super_Vector<double,_3U>.data_[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        ppAVar11 = ppAVar11 + 1;
        if (ppAVar11 == ppAVar5) {
          pAVar14 = (Atom *)0x0;
        }
        else {
          pAVar14 = *ppAVar11;
        }
      } while (pAVar14 != (Atom *)0x0);
    }
    pVVar12 = (this_00->position).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + lVar13 * 8) =
           *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + lVar13 * 8) / RVar15;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if ((uVar9 & 2) != 0) {
      pVVar12 = (this_00->velocity).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        pVVar12[iVar4].super_Vector<double,_3U>.data_[lVar13] =
             pVVar12[iVar4].super_Vector<double,_3U>.data_[lVar13] / RVar15;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
    }
  }
  return;
}

Assistant:

void updateCOM() {
      DataStorage& data = snapshotMan_->getCurrentSnapshot()->*storage_;
      bool needsVel     = false;
      if (data.getStorageLayout() & DataStorage::dslVelocity) needsVel = true;

      if (cutoffAtomList.size() == 1) {
        data.position[localIndex_] = cutoffAtomList[0]->getPos();
        if (needsVel) data.velocity[localIndex_] = cutoffAtomList[0]->getVel();
      } else {
        std::vector<Atom*>::iterator i;
        Atom* atom;
        RealType totalMass         = getMass();
        data.position[localIndex_] = V3Zero;
        if (needsVel) data.velocity[localIndex_] = V3Zero;

        for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          data.position[localIndex_] += atom->getMass() * atom->getPos();
          if (needsVel)
            data.velocity[localIndex_] += atom->getMass() * atom->getVel();
        }
        data.position[localIndex_] /= totalMass;
        if (needsVel) data.velocity[localIndex_] /= totalMass;
      }
    }